

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,ElementCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int32_t iVar13;
  fpclass_type fVar14;
  int32_t iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int start_00;
  uint uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  Element *pEVar30;
  Element local_78;
  ulong uVar25;
  
  uVar19 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar24 = end - 1;
    uVar25 = (ulong)uVar24;
    uVar21 = uVar24 - start;
    if (0x18 < (int)uVar21) {
LAB_0030973c:
      start_00 = (int)uVar19;
      iVar22 = (uVar21 >> 1) + start_00;
      pNVar1 = keys + iVar22;
      local_78.val.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)keys[iVar22].val.m_backend.data._M_elems;
      local_78.val.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(keys[iVar22].val.m_backend.data._M_elems + 2);
      puVar2 = keys[iVar22].val.m_backend.data._M_elems + 4;
      local_78.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_78.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_78.val.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(keys[iVar22].val.m_backend.data._M_elems + 8);
      local_78.val.m_backend.exp = keys[iVar22].val.m_backend.exp;
      local_78.val.m_backend.neg = keys[iVar22].val.m_backend.neg;
      local_78.val.m_backend.fpclass = keys[iVar22].val.m_backend.fpclass;
      local_78.val.m_backend.prec_elem = keys[iVar22].val.m_backend.prec_elem;
      local_78.idx = keys[iVar22].idx;
      iVar22 = (int)uVar25;
      lVar20 = (long)iVar22;
      lVar18 = (long)start_00;
      uVar27 = uVar25;
      uVar26 = uVar19;
      do {
        iVar29 = (int)uVar26;
        iVar17 = (int)uVar27;
        if ((type & 1U) == 0) {
          if (iVar29 < iVar22) {
            pEVar30 = keys + iVar29;
            lVar23 = 0;
            do {
              iVar16 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar30,&local_78);
              if (0 < iVar16) {
                uVar26 = (ulong)(uint)(iVar29 - (int)lVar23);
                break;
              }
              lVar23 = lVar23 + -1;
              pEVar30 = pEVar30 + 1;
              uVar26 = uVar25;
            } while ((long)iVar29 + -lVar20 != lVar23);
          }
          if (start_00 < iVar17) {
            uVar21 = (uint)uVar26;
            uVar26 = (ulong)iVar17;
            pEVar30 = keys + uVar26;
            do {
              iVar17 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar30,&local_78);
              uVar27 = uVar26;
              if (iVar17 < 1) break;
              uVar26 = uVar26 - 1;
              pEVar30 = pEVar30 + -1;
              uVar27 = uVar19;
            } while (lVar18 < (long)uVar26);
            goto LAB_0030990d;
          }
        }
        else {
          if (iVar29 < iVar22) {
            pEVar30 = keys + iVar29;
            lVar23 = 0;
            do {
              iVar16 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar30,&local_78);
              if (-1 < iVar16) {
                uVar26 = (ulong)(uint)(iVar29 - (int)lVar23);
                break;
              }
              lVar23 = lVar23 + -1;
              pEVar30 = pEVar30 + 1;
              uVar26 = uVar25;
            } while ((long)iVar29 + -lVar20 != lVar23);
          }
          uVar21 = (uint)uVar26;
          if (start_00 < iVar17) {
            uVar26 = (ulong)iVar17;
            pEVar30 = keys + uVar26;
            do {
              iVar17 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar30,&local_78);
              uVar27 = uVar26;
              if (iVar17 < 0) break;
              uVar26 = uVar26 - 1;
              pEVar30 = pEVar30 + -1;
              uVar27 = uVar19;
            } while (lVar18 < (long)uVar26);
LAB_0030990d:
            uVar26 = (ulong)uVar21;
          }
        }
        iVar29 = (int)uVar26;
        iVar17 = (int)uVar27;
        if (iVar17 <= iVar29) goto LAB_003099e4;
        uVar5 = *(undefined8 *)(keys[iVar29].val.m_backend.data._M_elems + 8);
        uVar6 = *(undefined8 *)keys[iVar29].val.m_backend.data._M_elems;
        uVar7 = *(undefined8 *)(keys[iVar29].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 4;
        uVar8 = *(undefined8 *)puVar2;
        uVar9 = *(undefined8 *)(puVar2 + 2);
        iVar16 = keys[iVar29].val.m_backend.exp;
        bVar3 = keys[iVar29].val.m_backend.neg;
        iVar4 = keys[iVar29].idx;
        uVar10 = *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar17].val.m_backend.data._M_elems + 4;
        uVar11 = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        *(undefined8 *)keys[iVar29].val.m_backend.data._M_elems =
             *(undefined8 *)keys[iVar17].val.m_backend.data._M_elems;
        *(undefined8 *)(keys[iVar29].val.m_backend.data._M_elems + 2) = uVar10;
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar11;
        *(undefined8 *)(puVar2 + 2) = uVar12;
        *(undefined8 *)(keys[iVar29].val.m_backend.data._M_elems + 8) =
             *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 8);
        keys[iVar29].val.m_backend.exp = keys[iVar17].val.m_backend.exp;
        keys[iVar29].val.m_backend.neg = keys[iVar17].val.m_backend.neg;
        keys[iVar29].idx = keys[iVar17].idx;
        *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 8) = uVar5;
        puVar2 = keys[iVar17].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar8;
        *(undefined8 *)(puVar2 + 2) = uVar9;
        *(undefined8 *)keys[iVar17].val.m_backend.data._M_elems = uVar6;
        *(undefined8 *)(keys[iVar17].val.m_backend.data._M_elems + 2) = uVar7;
        keys[iVar17].val.m_backend.exp = iVar16;
        keys[iVar17].val.m_backend.neg = bVar3;
        fVar14 = keys[iVar29].val.m_backend.fpclass;
        iVar15 = keys[iVar29].val.m_backend.prec_elem;
        iVar13 = keys[iVar17].val.m_backend.prec_elem;
        keys[iVar29].val.m_backend.fpclass = keys[iVar17].val.m_backend.fpclass;
        keys[iVar29].val.m_backend.prec_elem = iVar13;
        keys[iVar17].val.m_backend.fpclass = fVar14;
        keys[iVar17].val.m_backend.prec_elem = iVar15;
        keys[iVar17].idx = iVar4;
        uVar26 = (ulong)(iVar29 + 1);
        uVar27 = (ulong)(iVar17 - 1);
      } while( true );
    }
LAB_00309c66:
    if (0 < (int)uVar21) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                (keys,uVar24,compare,start);
    }
  }
  return;
LAB_003099e4:
  if ((type & 1U) == 0) {
    if (start_00 < iVar17) {
      uVar28 = (ulong)iVar17;
      pEVar30 = keys + uVar28;
      do {
        iVar17 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_78,pEVar30);
        uVar27 = uVar28;
        if (0 < iVar17) break;
        uVar28 = uVar28 - 1;
        pEVar30 = pEVar30 + -1;
        uVar27 = uVar19;
      } while (lVar18 < (long)uVar28);
    }
    if ((int)uVar27 == iVar22) {
      uVar5 = *(undefined8 *)(keys[lVar20].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[lVar20].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[lVar20].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar20].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar17 = keys[lVar20].val.m_backend.exp;
      bVar3 = keys[lVar20].val.m_backend.neg;
      iVar29 = keys[lVar20].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[lVar20].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar20].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[lVar20].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[lVar20].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[lVar20].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar20].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar20].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar17;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar14 = keys[lVar20].val.m_backend.fpclass;
      iVar15 = keys[lVar20].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar20].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar20].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar29;
      uVar27 = (ulong)(iVar22 - 1);
    }
  }
  else {
    if (iVar29 < iVar22) {
      pEVar30 = keys + iVar29;
      lVar23 = 0;
      do {
        iVar17 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_78,pEVar30);
        if (iVar17 < 0) {
          uVar26 = (ulong)(uint)(iVar29 - (int)lVar23);
          break;
        }
        lVar23 = lVar23 + -1;
        pEVar30 = pEVar30 + 1;
        uVar26 = uVar25;
      } while (iVar29 - lVar20 != lVar23);
    }
    if ((int)uVar26 == start_00) {
      uVar5 = *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[lVar18].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar18].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar17 = keys[lVar18].val.m_backend.exp;
      bVar3 = keys[lVar18].val.m_backend.neg;
      iVar29 = keys[lVar18].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[lVar18].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[lVar18].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[lVar18].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar18].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar18].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar17;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar14 = keys[lVar18].val.m_backend.fpclass;
      iVar15 = keys[lVar18].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar18].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar18].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar29;
      uVar26 = (ulong)(start_00 + 1);
    }
  }
  iVar17 = (int)uVar27;
  uVar21 = iVar17 - start_00;
  iVar29 = (int)uVar26;
  uVar24 = iVar22 - iVar29;
  if ((int)uVar24 < (int)uVar21) {
    uVar25 = uVar27 & 0xffffffff;
    uVar26 = uVar19;
    uVar24 = uVar21;
    iVar17 = iVar22;
    start_00 = iVar29;
    if (iVar22 <= iVar29) goto LAB_00309c4b;
  }
  else {
    uVar19 = uVar26;
    uVar21 = uVar24;
    if (iVar17 <= start_00) goto LAB_00309c4b;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
            (keys,iVar17 + 1,compare,start_00,(bool)(~type & 1));
  uVar19 = uVar26;
  uVar21 = uVar24;
LAB_00309c4b:
  uVar24 = (uint)uVar25;
  start = (int)uVar19;
  type = (bool)(type ^ 1);
  if ((int)uVar21 < 0x19) goto LAB_00309c66;
  goto LAB_0030973c;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}